

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commonutils.cpp
# Opt level: O1

ComponentPtr owningComponent(ParentedEntityConstPtr *entity)

{
  ulong extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined1 auVar2 [16];
  ComponentPtr CVar3;
  long local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::ParentedEntity::parent();
  if (local_20 == 0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = extraout_RDX;
    auVar2 = auVar2 << 0x40;
  }
  else {
    auVar2 = __dynamic_cast(local_20,&libcellml::ParentedEntity::typeinfo,
                            &libcellml::Component::typeinfo,0);
  }
  _Var1._M_pi = auVar2._8_8_;
  if (auVar2._0_8_ == (element_type *)0x0) {
    (entity->super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
         = (element_type *)0x0;
    (entity->super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>).
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    (entity->super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
         = auVar2._0_8_;
    (entity->super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>).
    _M_refcount._M_pi = local_18;
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_18 + 8) = *(int *)(local_18 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_18 + 8) = *(int *)(local_18 + 8) + 1;
      }
    }
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    _Var1._M_pi = extraout_RDX_00;
  }
  CVar3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  CVar3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)entity;
  return (ComponentPtr)CVar3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

libcellml::ComponentPtr owningComponent(const libcellml::ParentedEntityConstPtr &entity)
{
    return std::dynamic_pointer_cast<libcellml::Component>(entity->parent());
}